

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

uint8_t * av1_get_compound_type_mask(INTERINTER_COMPOUND_DATA *comp_data,BLOCK_SIZE sb_type)

{
  BLOCK_SIZE in_SIL;
  undefined8 *in_RDI;
  uint8_t *local_8;
  
  if (*(char *)((long)in_RDI + 0xb) == '\x02') {
    local_8 = av1_get_contiguous_soft_mask
                        (*(int8_t *)(in_RDI + 1),*(int8_t *)((long)in_RDI + 9),in_SIL);
  }
  else {
    local_8 = (uint8_t *)*in_RDI;
  }
  return local_8;
}

Assistant:

const uint8_t *av1_get_compound_type_mask(
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE sb_type) {
  (void)sb_type;
  switch (comp_data->type) {
    case COMPOUND_WEDGE:
      return av1_get_contiguous_soft_mask(comp_data->wedge_index,
                                          comp_data->wedge_sign, sb_type);
    default: return comp_data->seg_mask;
  }
}